

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestQueue.cpp
# Opt level: O0

void anon_unknown.dwarf_1098d3::readq(QueueReader *r,size_t size)

{
  Result *in_stack_00000070;
  ReadResult rr;
  ExpressionDecomposer *this;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar1;
  ExpressionDecomposer local_64;
  QueueReader *in_stack_ffffffffffffffa0;
  unsigned_long *in_stack_ffffffffffffffe0;
  Expression_lhs<unsigned_long> *in_stack_ffffffffffffffe8;
  
  binlog::detail::QueueReader::beginRead(in_stack_ffffffffffffffa0);
  this = &local_64;
  uVar1 = 10;
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(this,DT_CHECK);
  doctest::detail::ExpressionDecomposer::operator<<
            ((ExpressionDecomposer *)CONCAT44(uVar1,in_stack_ffffffffffffff60),(unsigned_long *)this
            );
  doctest::detail::Expression_lhs<unsigned_long>::operator>=
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  doctest::detail::decomp_assert
            (rr.size2._4_4_,rr.buffer2,rr.size1._4_4_,rr.buffer1,in_stack_00000070);
  doctest::detail::Result::~Result((Result *)0x207ada);
  binlog::detail::QueueReader::endRead((QueueReader *)CONCAT44(uVar1,in_stack_ffffffffffffff60));
  return;
}

Assistant:

void readq(binlog::detail::QueueReader& r, std::size_t size)
{
  const auto rr = r.beginRead();
  CHECK(rr.size1 + rr.size2 >= size);
  r.endRead();
}